

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::generate_const(t_rs_generator *this,t_const *tconst)

{
  bool bVar1;
  t_type *ttype_00;
  t_const_value *tvalue_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  t_const_value *tvalue;
  t_type *ttype;
  string name;
  t_const *tconst_local;
  t_rs_generator *this_local;
  
  name.field_2._8_8_ = tconst;
  t_const::get_name_abi_cxx11_((string *)&ttype,tconst);
  ttype_00 = t_const::get_type((t_const *)name.field_2._8_8_);
  tvalue_00 = t_const::get_value((t_const *)name.field_2._8_8_);
  bVar1 = can_generate_simple_const(this,ttype_00);
  if (bVar1) {
    render_const_value(this,(string *)&ttype,ttype_00,tvalue_00);
  }
  else {
    bVar1 = can_generate_const_holder(this,ttype_00);
    if (!bVar1) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(__return_storage_ptr__,"cannot generate const for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ttype);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    render_const_value_holder(this,(string *)&ttype,ttype_00,tvalue_00);
  }
  std::__cxx11::string::~string((string *)&ttype);
  return;
}

Assistant:

void t_rs_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  t_type* ttype = tconst->get_type();
  t_const_value* tvalue = tconst->get_value();

  if (can_generate_simple_const(ttype)) {
    render_const_value(name, ttype, tvalue);
  } else if (can_generate_const_holder(ttype)) {
    render_const_value_holder(name, ttype, tvalue);
  } else {
    throw "cannot generate const for " + name;
  }
}